

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::BuildFieldOrExtension
          (DescriptorBuilder *this,FieldDescriptorProto *proto,Descriptor *parent,
          FieldDescriptor *result,bool is_extension)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Tables *pTVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  double dVar4;
  Symbol symbol;
  int iVar5;
  uint uVar6;
  undefined4 uVar7;
  Descriptor *pDVar8;
  string *psVar9;
  string *psVar10;
  long *plVar11;
  size_t sVar12;
  long lVar13;
  undefined8 *puVar15;
  size_type *psVar16;
  size_type sVar17;
  undefined1 *orig_options;
  undefined7 in_register_00000081;
  float fVar18;
  SubstituteArg *in_stack_fffffffffffffd78;
  string local_270;
  string *local_240;
  string *local_238;
  string local_230;
  string lowercase_name;
  SubstituteArg local_1f0;
  char *end_pos;
  int local_1b8;
  undefined4 local_190;
  undefined4 uStack_18c;
  FieldDescriptor *pFStack_188;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  ulong uVar14;
  
  pDVar8 = parent;
  if (parent == (Descriptor *)0x0) {
    pDVar8 = (Descriptor *)this->file_;
  }
  psVar9 = AllocateNameString(this,*(string **)(pDVar8 + 8),(proto->name_).ptr_);
  ValidateSymbolName(this,(proto->name_).ptr_,psVar9,&proto->super_Message);
  psVar10 = DescriptorPool::Tables::AllocateString(this->tables_,(proto->name_).ptr_);
  *(string **)result = psVar10;
  *(string **)(result + 8) = psVar9;
  *(FileDescriptor **)(result + 0x28) = this->file_;
  *(int32 *)(result + 0x44) = proto->number_;
  local_240 = (string *)CONCAT44(local_240._4_4_,(int)CONCAT71(in_register_00000081,is_extension));
  result[0x42] = (FieldDescriptor)is_extension;
  psVar9 = (proto->name_).ptr_;
  lowercase_name._M_dataplus._M_p = (pointer)&lowercase_name.field_2;
  pcVar2 = (psVar9->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&lowercase_name,pcVar2,pcVar2 + psVar9->_M_string_length);
  if (lowercase_name._M_string_length != 0) {
    sVar17 = 0;
    do {
      if ((byte)(lowercase_name._M_dataplus._M_p[sVar17] + 0xbfU) < 0x1a) {
        lowercase_name._M_dataplus._M_p[sVar17] = lowercase_name._M_dataplus._M_p[sVar17] | 0x20;
      }
      sVar17 = sVar17 + 1;
    } while (lowercase_name._M_string_length != sVar17);
  }
  psVar9 = (proto->name_).ptr_;
  if ((lowercase_name._M_string_length == psVar9->_M_string_length) &&
     ((lowercase_name._M_string_length == 0 ||
      (iVar5 = bcmp(lowercase_name._M_dataplus._M_p,(psVar9->_M_dataplus)._M_p,
                    lowercase_name._M_string_length), iVar5 == 0)))) {
    psVar9 = *(string **)result;
  }
  else {
    psVar9 = DescriptorPool::Tables::AllocateString(this->tables_,&lowercase_name);
  }
  *(string **)(result + 0x10) = psVar9;
  pTVar3 = this->tables_;
  anon_unknown_1::ToCamelCase(&local_270,(proto->name_).ptr_,true);
  psVar9 = DescriptorPool::Tables::AllocateString(pTVar3,&local_270);
  *(string **)(result + 0x18) = psVar9;
  paVar1 = &local_270.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar1) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  if (((proto->_has_bits_).has_bits_[0] & 0x10) == 0) {
    result[0x41] = (FieldDescriptor)0x0;
    pTVar3 = this->tables_;
    anon_unknown_1::ToJsonName(&local_270,(proto->name_).ptr_);
    psVar9 = DescriptorPool::Tables::AllocateString(pTVar3,&local_270);
    *(string **)(result + 0x20) = psVar9;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != paVar1) {
      operator_delete(local_270._M_dataplus._M_p);
    }
  }
  else {
    result[0x41] = (FieldDescriptor)0x1;
    psVar9 = DescriptorPool::Tables::AllocateString(this->tables_,(proto->json_name_).ptr_);
    *(string **)(result + 0x20) = psVar9;
  }
  *(int *)(result + 0x38) = proto->type_;
  iVar5 = proto->label_;
  *(int *)(result + 0x3c) = iVar5;
  if ((iVar5 == 2 & (byte)result[0x42]) == 1) {
    psVar9 = *(string **)(result + 8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f0,
                   "The extension ",psVar9);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_1f0);
    psVar16 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_270.field_2._M_allocated_capacity = *psVar16;
      local_270.field_2._8_8_ = plVar11[3];
      local_270._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_270.field_2._M_allocated_capacity = *psVar16;
      local_270._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_270._M_string_length = plVar11[1];
    *plVar11 = (long)psVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    AddError(this,psVar9,&proto->super_Message,TYPE,&local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != paVar1) {
      operator_delete(local_270._M_dataplus._M_p);
    }
    if ((FieldDescriptor *)local_1f0.text_ != (FieldDescriptor *)(local_1f0.scratch_ + 4)) {
      operator_delete(local_1f0.text_);
    }
  }
  *(undefined8 *)(result + 0x50) = 0;
  *(undefined8 *)(result + 0x30) = 0;
  *(undefined8 *)(result + 0x60) = 0;
  *(undefined8 *)(result + 0x68) = 0;
  *(undefined8 *)(result + 0x70) = 0;
  *(undefined8 *)(result + 0x80) = 0;
  *(undefined8 *)(result + 0x88) = 0;
  *(undefined8 *)(result + 0x90) = 0;
  uVar6 = (proto->_has_bits_).has_bits_[0] & 8;
  result[0x40] = SUB41(uVar6 >> 3,0);
  if ((uVar6 != 0) && (*(int *)(result + 0x3c) == 3)) {
    AddError(this,*(string **)(result + 8),&proto->super_Message,DEFAULT_VALUE,
             "Repeated fields can\'t have default values.");
  }
  uVar6 = (proto->_has_bits_).has_bits_[0];
  if ((uVar6 >> 9 & 1) == 0) goto switchD_002ce23a_default;
  if ((uVar6 & 8) == 0) {
    if (*(once_flag **)(result + 0x30) != (once_flag *)0x0) {
      local_270._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_1f0.text_ = (char *)result;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(result + 0x30),(_func_void_FieldDescriptor_ptr **)&local_270,
                 (FieldDescriptor **)&local_1f0);
    }
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(result + 0x38) * 4)
          ) {
    case 1:
    case 3:
    case 6:
      *(undefined4 *)(result + 0x90) = 0;
      break;
    case 2:
    case 4:
    case 5:
    case 8:
      *(undefined8 *)(result + 0x90) = 0;
      break;
    case 7:
      result[0x90] = (FieldDescriptor)0x0;
      break;
    case 9:
      internal::InitProtobufDefaults();
      *(undefined8 **)(result + 0x90) = &internal::fixed_address_empty_string_abi_cxx11_;
    }
    goto switchD_002ce23a_default;
  }
  end_pos = (char *)0x0;
  if (*(once_flag **)(result + 0x30) != (once_flag *)0x0) {
    local_270._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_1f0.text_ = (char *)result;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(result + 0x30),(_func_void_FieldDescriptor_ptr **)&local_270,
               (FieldDescriptor **)&local_1f0);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(result + 0x38) * 4))
  {
  case 1:
    lVar13 = strtol((((proto->default_value_).ptr_)->_M_dataplus)._M_p,&end_pos,0);
    uVar7 = (undefined4)lVar13;
    goto LAB_002ce761;
  case 2:
    psVar9 = (string *)strtoll((((proto->default_value_).ptr_)->_M_dataplus)._M_p,&end_pos,0);
    goto LAB_002ce948;
  case 3:
    uVar14 = strtoul((((proto->default_value_).ptr_)->_M_dataplus)._M_p,&end_pos,0);
    uVar7 = (undefined4)uVar14;
LAB_002ce761:
    *(undefined4 *)(result + 0x90) = uVar7;
    break;
  case 4:
    psVar9 = (string *)strtoull((((proto->default_value_).ptr_)->_M_dataplus)._M_p,&end_pos,0);
    goto LAB_002ce948;
  case 5:
    iVar5 = std::__cxx11::string::compare((char *)(proto->default_value_).ptr_);
    if (iVar5 == 0) {
      psVar9 = (string *)0x7ff0000000000000;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)(proto->default_value_).ptr_);
      if (iVar5 == 0) {
        psVar9 = (string *)0xfff0000000000000;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)(proto->default_value_).ptr_);
        if (iVar5 != 0) {
          dVar4 = io::NoLocaleStrtod((((proto->default_value_).ptr_)->_M_dataplus)._M_p,&end_pos);
          *(double *)(result + 0x90) = dVar4;
          break;
        }
        psVar9 = (string *)0x7ff8000000000000;
      }
    }
LAB_002ce948:
    *(string **)(result + 0x90) = psVar9;
    break;
  case 6:
    iVar5 = std::__cxx11::string::compare((char *)(proto->default_value_).ptr_);
    if (iVar5 == 0) {
      *(undefined4 *)(result + 0x90) = 0x7f800000;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)(proto->default_value_).ptr_);
      if (iVar5 == 0) {
        *(undefined4 *)(result + 0x90) = 0xff800000;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)(proto->default_value_).ptr_);
        if (iVar5 == 0) {
          *(undefined4 *)(result + 0x90) = 0x7fc00000;
        }
        else {
          dVar4 = io::NoLocaleStrtod((((proto->default_value_).ptr_)->_M_dataplus)._M_p,&end_pos);
          fVar18 = io::SafeDoubleToFloat(dVar4);
          *(float *)(result + 0x90) = fVar18;
        }
      }
    }
    break;
  case 7:
    iVar5 = std::__cxx11::string::compare((char *)(proto->default_value_).ptr_);
    if (iVar5 == 0) {
      result[0x90] = (FieldDescriptor)0x1;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)(proto->default_value_).ptr_);
      if (iVar5 == 0) {
        result[0x90] = (FieldDescriptor)0x0;
      }
      else {
        AddError(this,*(string **)(result + 8),&proto->super_Message,DEFAULT_VALUE,
                 "Boolean default must be true or false.");
      }
    }
    break;
  case 8:
    *(undefined8 *)(result + 0x90) = 0;
    break;
  case 9:
    if (*(once_flag **)(result + 0x30) != (once_flag *)0x0) {
      local_270._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_1f0.text_ = (char *)result;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(result + 0x30),(_func_void_FieldDescriptor_ptr **)&local_270,
                 (FieldDescriptor **)&local_1f0);
    }
    pTVar3 = this->tables_;
    if (*(int *)(result + 0x38) != 0xc) {
      psVar9 = DescriptorPool::Tables::AllocateString(pTVar3,(proto->default_value_).ptr_);
      goto LAB_002ce948;
    }
    UnescapeCEscapeString(&local_270,(proto->default_value_).ptr_);
    psVar9 = DescriptorPool::Tables::AllocateString(pTVar3,&local_270);
    *(string **)(result + 0x90) = psVar9;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != paVar1) {
      operator_delete(local_270._M_dataplus._M_p);
    }
    break;
  case 10:
    AddError(this,*(string **)(result + 8),&proto->super_Message,DEFAULT_VALUE,
             "Messages can\'t have default values.");
    result[0x40] = (FieldDescriptor)0x0;
  }
  if ((end_pos != (char *)0x0) &&
     ((__rhs = (proto->default_value_).ptr_, __rhs->_M_string_length == 0 || (*end_pos != '\0')))) {
    psVar9 = *(string **)(result + 8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f0,
                   "Couldn\'t parse default value \"",__rhs);
    puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f0);
    psVar16 = puVar15 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_270.field_2._M_allocated_capacity = *psVar16;
      local_270.field_2._8_8_ = puVar15[3];
      local_270._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_270.field_2._M_allocated_capacity = *psVar16;
      local_270._M_dataplus._M_p = (pointer)*puVar15;
    }
    local_270._M_string_length = puVar15[1];
    *puVar15 = psVar16;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    AddError(this,psVar9,&proto->super_Message,DEFAULT_VALUE,&local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != paVar1) {
      operator_delete(local_270._M_dataplus._M_p);
    }
    if ((FieldDescriptor *)local_1f0.text_ != (FieldDescriptor *)(local_1f0.scratch_ + 4)) {
      operator_delete(local_1f0.text_);
    }
  }
switchD_002ce23a_default:
  iVar5 = *(int *)(result + 0x44);
  if (iVar5 < 1) {
    AddError(this,*(string **)(result + 8),&proto->super_Message,NUMBER,
             "Field numbers must be positive integers.");
  }
  else if (iVar5 < 0x20000000 || (char)local_240 != '\0') {
    if (iVar5 - 19000U < 1000) {
      psVar9 = *(string **)(result + 8);
      local_270._M_dataplus._M_p =
           FastInt32ToBuffer(19000,(char *)((long)&local_270._M_string_length + 4));
      local_238 = psVar9;
      sVar12 = strlen(local_270._M_dataplus._M_p);
      local_270._M_string_length = CONCAT44(local_270._M_string_length._4_4_,(int)sVar12);
      local_1f0.text_ = FastInt32ToBuffer(19999,local_1f0.scratch_);
      sVar12 = strlen(local_1f0.text_);
      local_1f0.size_ = (int)sVar12;
      end_pos = (char *)0x0;
      local_1b8 = -1;
      local_60.text_ = (char *)0x0;
      local_60.size_ = -1;
      local_90.text_ = (char *)0x0;
      local_90.size_ = -1;
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      strings::Substitute_abi_cxx11_
                (&local_230,
                 (strings *)
                 "Field numbers $0 through $1 are reserved for the protocol buffer library implementation."
                 ,(char *)&local_270,&local_1f0,(SubstituteArg *)&end_pos,&local_60,&local_90,
                 &local_c0,&local_f0,&local_120,&local_150,&local_180,in_stack_fffffffffffffd78);
      AddError(this,local_238,&proto->super_Message,NUMBER,&local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) goto LAB_002ce389;
    }
  }
  else {
    local_238 = *(string **)(result + 8);
    local_270._M_dataplus._M_p =
         FastInt32ToBuffer(0x1fffffff,(char *)((long)&local_270._M_string_length + 4));
    sVar12 = strlen(local_270._M_dataplus._M_p);
    local_270._M_string_length = CONCAT44(local_270._M_string_length._4_4_,(int)sVar12);
    local_1f0.text_ = (char *)0x0;
    local_1f0.size_ = -1;
    end_pos = (char *)0x0;
    local_1b8 = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    strings::Substitute_abi_cxx11_
              (&local_230,(strings *)"Field numbers cannot be greater than $0.",(char *)&local_270,
               &local_1f0,(SubstituteArg *)&end_pos,&local_60,&local_90,&local_c0,&local_f0,
               &local_120,&local_150,&local_180,in_stack_fffffffffffffd78);
    AddError(this,local_238,&proto->super_Message,NUMBER,&local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
LAB_002ce389:
      operator_delete(local_230._M_dataplus._M_p);
    }
  }
  uVar6 = (proto->_has_bits_).has_bits_[0];
  if ((char)local_240 == '\0') {
    if ((uVar6 & 2) != 0) {
      AddError(this,*(string **)(result + 8),&proto->super_Message,EXTENDEE,
               "FieldDescriptorProto.extendee set for non-extension field.");
    }
    *(Descriptor **)(result + 0x50) = parent;
    if (((proto->_has_bits_).has_bits_[0] & 0x80) != 0) {
      iVar5 = proto->oneof_index_;
      if ((-1 < (long)iVar5) && (iVar5 < *(int *)(parent + 0x6c))) {
        lVar13 = (long)iVar5 * 0x30 + *(long *)(parent + 0x30);
        goto LAB_002ce5e6;
      }
      local_240 = *(string **)(result + 8);
      local_270._M_dataplus._M_p =
           FastInt32ToBuffer(iVar5,(char *)((long)&local_270._M_string_length + 4));
      sVar12 = strlen(local_270._M_dataplus._M_p);
      local_270._M_string_length = CONCAT44(local_270._M_string_length._4_4_,(int)sVar12);
      local_1f0.text_ = (char *)**(undefined8 **)parent;
      local_1f0.size_ = *(int *)(*(undefined8 **)parent + 1);
      end_pos = (char *)0x0;
      local_1b8 = -1;
      local_60.text_ = (char *)0x0;
      local_60.size_ = -1;
      local_90.text_ = (char *)0x0;
      local_90.size_ = -1;
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      strings::Substitute_abi_cxx11_
                (&local_230,
                 (strings *)"FieldDescriptorProto.oneof_index $0 is out of range for type \"$1\".",
                 (char *)&local_270,&local_1f0,(SubstituteArg *)&end_pos,&local_60,&local_90,
                 &local_c0,&local_f0,&local_120,&local_150,&local_180,in_stack_fffffffffffffd78);
      AddError(this,local_240,&proto->super_Message,TYPE,&local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p);
      }
    }
  }
  else {
    if ((uVar6 & 2) == 0) {
      AddError(this,*(string **)(result + 8),&proto->super_Message,EXTENDEE,
               "FieldDescriptorProto.extendee not set for extension field.");
    }
    *(Descriptor **)(result + 0x60) = parent;
    if (((proto->_has_bits_).has_bits_[0] & 0x80) != 0) {
      AddError(this,*(string **)(result + 8),&proto->super_Message,TYPE,
               "FieldDescriptorProto.oneof_index should not be set for extensions.");
    }
  }
  lVar13 = 0;
LAB_002ce5e6:
  *(long *)(result + 0x58) = lVar13;
  if (((proto->_has_bits_).has_bits_[0] & 0x20) == 0) {
    *(undefined8 *)(result + 0x78) = 0;
  }
  else {
    orig_options = (undefined1 *)proto->options_;
    if ((FieldOptions *)orig_options == (FieldOptions *)0x0) {
      orig_options = _FieldOptions_default_instance_;
    }
    AllocateOptions<google::protobuf::FieldDescriptor>(this,(OptionsType *)orig_options,result,8);
  }
  local_190 = 2;
  symbol._4_4_ = uStack_18c;
  symbol.type = 2;
  symbol.field_1.field_descriptor = result;
  pFStack_188 = result;
  AddSymbol(this,*(string **)(result + 8),parent,*(string **)result,&proto->super_Message,symbol);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lowercase_name._M_dataplus._M_p != &lowercase_name.field_2) {
    operator_delete(lowercase_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void DescriptorBuilder::BuildFieldOrExtension(const FieldDescriptorProto& proto,
                                              const Descriptor* parent,
                                              FieldDescriptor* result,
                                              bool is_extension) {
  const std::string& scope =
      (parent == nullptr) ? file_->package() : parent->full_name();
  std::string* full_name = AllocateNameString(scope, proto.name());
  ValidateSymbolName(proto.name(), *full_name, proto);

  result->name_ = tables_->AllocateString(proto.name());
  result->full_name_ = full_name;
  result->file_ = file_;
  result->number_ = proto.number();
  result->is_extension_ = is_extension;

  // If .proto files follow the style guide then the name should already be
  // lower-cased.  If that's the case we can just reuse the string we
  // already allocated rather than allocate a new one.
  std::string lowercase_name(proto.name());
  LowerString(&lowercase_name);
  if (lowercase_name == proto.name()) {
    result->lowercase_name_ = result->name_;
  } else {
    result->lowercase_name_ = tables_->AllocateString(lowercase_name);
  }

  // Don't bother with the above optimization for camel-case names since
  // .proto files that follow the guide shouldn't be using names in this
  // format, so the optimization wouldn't help much.
  result->camelcase_name_ =
      tables_->AllocateString(ToCamelCase(proto.name(),
                                          /* lower_first = */ true));

  if (proto.has_json_name()) {
    result->has_json_name_ = true;
    result->json_name_ = tables_->AllocateString(proto.json_name());
  } else {
    result->has_json_name_ = false;
    result->json_name_ = tables_->AllocateString(ToJsonName(proto.name()));
  }

  // Some compilers do not allow static_cast directly between two enum types,
  // so we must cast to int first.
  result->type_ = static_cast<FieldDescriptor::Type>(
      implicit_cast<int>(proto.type()));
  result->label_ = static_cast<FieldDescriptor::Label>(
      implicit_cast<int>(proto.label()));

  // An extension cannot have a required field (b/13365836).
  if (result->is_extension_ &&
      result->label_ == FieldDescriptor::LABEL_REQUIRED) {
    AddError(result->full_name(), proto,
             // Error location `TYPE`: we would really like to indicate
             // `LABEL`, but the `ErrorLocation` enum has no entry for this, and
             // we don't necessarily know about all implementations of the
             // `ErrorCollector` interface to extend them to handle the new
             // error location type properly.
             DescriptorPool::ErrorCollector::TYPE,
             "The extension " + result->full_name() + " cannot be required.");
  }

  // Some of these may be filled in when cross-linking.
  result->containing_type_ = nullptr;
  result->extension_scope_ = nullptr;
  result->message_type_ = nullptr;
  result->enum_type_ = nullptr;
  result->type_name_ = nullptr;
  result->type_once_ = nullptr;
  result->default_value_enum_ = nullptr;
  result->default_value_enum_name_ = nullptr;

  result->has_default_value_ = proto.has_default_value();
  if (proto.has_default_value() && result->is_repeated()) {
    AddError(result->full_name(), proto,
             DescriptorPool::ErrorCollector::DEFAULT_VALUE,
             "Repeated fields can't have default values.");
  }

  if (proto.has_type()) {
    if (proto.has_default_value()) {
      char* end_pos = nullptr;
      switch (result->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
          result->default_value_int32_ =
              strtol(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_INT64:
          result->default_value_int64_ =
              strto64(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_UINT32:
          result->default_value_uint32_ =
              strtoul(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_UINT64:
          result->default_value_uint64_ =
              strtou64(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_FLOAT:
          if (proto.default_value() == "inf") {
            result->default_value_float_ =
                std::numeric_limits<float>::infinity();
          } else if (proto.default_value() == "-inf") {
            result->default_value_float_ =
                -std::numeric_limits<float>::infinity();
          } else if (proto.default_value() == "nan") {
            result->default_value_float_ =
                std::numeric_limits<float>::quiet_NaN();
          } else {
            result->default_value_float_ = io::SafeDoubleToFloat(
                io::NoLocaleStrtod(proto.default_value().c_str(), &end_pos));
          }
          break;
        case FieldDescriptor::CPPTYPE_DOUBLE:
          if (proto.default_value() == "inf") {
            result->default_value_double_ =
                std::numeric_limits<double>::infinity();
          } else if (proto.default_value() == "-inf") {
            result->default_value_double_ =
                -std::numeric_limits<double>::infinity();
          } else if (proto.default_value() == "nan") {
            result->default_value_double_ =
                std::numeric_limits<double>::quiet_NaN();
          } else {
            result->default_value_double_ =
                io::NoLocaleStrtod(proto.default_value().c_str(), &end_pos);
          }
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          if (proto.default_value() == "true") {
            result->default_value_bool_ = true;
          } else if (proto.default_value() == "false") {
            result->default_value_bool_ = false;
          } else {
            AddError(result->full_name(), proto,
                     DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                     "Boolean default must be true or false.");
          }
          break;
        case FieldDescriptor::CPPTYPE_ENUM:
          // This will be filled in when cross-linking.
          result->default_value_enum_ = nullptr;
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          if (result->type() == FieldDescriptor::TYPE_BYTES) {
            result->default_value_string_ = tables_->AllocateString(
                UnescapeCEscapeString(proto.default_value()));
          } else {
            result->default_value_string_ =
                tables_->AllocateString(proto.default_value());
          }
          break;
        case FieldDescriptor::CPPTYPE_MESSAGE:
          AddError(result->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Messages can't have default values.");
          result->has_default_value_ = false;
          break;
      }

      if (end_pos != nullptr) {
        // end_pos is only set non-null by the parsers for numeric types,
        // above. This checks that the default was non-empty and had no extra
        // junk after the end of the number.
        if (proto.default_value().empty() || *end_pos != '\0') {
          AddError(result->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Couldn't parse default value \"" + proto.default_value() +
                       "\".");
        }
      }
    } else {
      // No explicit default value
      switch (result->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
          result->default_value_int32_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_INT64:
          result->default_value_int64_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_UINT32:
          result->default_value_uint32_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_UINT64:
          result->default_value_uint64_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_FLOAT:
          result->default_value_float_ = 0.0f;
          break;
        case FieldDescriptor::CPPTYPE_DOUBLE:
          result->default_value_double_ = 0.0;
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          result->default_value_bool_ = false;
          break;
        case FieldDescriptor::CPPTYPE_ENUM:
          // This will be filled in when cross-linking.
          result->default_value_enum_ = nullptr;
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          result->default_value_string_ = &internal::GetEmptyString();
          break;
        case FieldDescriptor::CPPTYPE_MESSAGE:
          break;
      }
    }
  }

  if (result->number() <= 0) {
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             "Field numbers must be positive integers.");
  } else if (!is_extension && result->number() > FieldDescriptor::kMaxNumber) {
    // Only validate that the number is within the valid field range if it is
    // not an extension. Since extension numbers are validated with the
    // extendee's valid set of extension numbers, and those are in turn
    // validated against the max allowed number, the check is unnecessary for
    // extension fields.
    // This avoids cross-linking issues that arise when attempting to check if
    // the extendee is a message_set_wire_format message, which has a higher max
    // on extension numbers.
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             strings::Substitute("Field numbers cannot be greater than $0.",
                                 FieldDescriptor::kMaxNumber));
  } else if (result->number() >= FieldDescriptor::kFirstReservedNumber &&
             result->number() <= FieldDescriptor::kLastReservedNumber) {
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             strings::Substitute(
                 "Field numbers $0 through $1 are reserved for the protocol "
                 "buffer library implementation.",
                 FieldDescriptor::kFirstReservedNumber,
                 FieldDescriptor::kLastReservedNumber));
  }

  if (is_extension) {
    if (!proto.has_extendee()) {
      AddError(result->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "FieldDescriptorProto.extendee not set for extension field.");
    }

    result->extension_scope_ = parent;

    if (proto.has_oneof_index()) {
      AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "FieldDescriptorProto.oneof_index should not be set for "
               "extensions.");
    }

    // Fill in later (maybe).
    result->containing_oneof_ = nullptr;
  } else {
    if (proto.has_extendee()) {
      AddError(result->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "FieldDescriptorProto.extendee set for non-extension field.");
    }

    result->containing_type_ = parent;

    if (proto.has_oneof_index()) {
      if (proto.oneof_index() < 0 ||
          proto.oneof_index() >= parent->oneof_decl_count()) {
        AddError(result->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 strings::Substitute("FieldDescriptorProto.oneof_index $0 is "
                                     "out of range for type \"$1\".",
                                     proto.oneof_index(), parent->name()));
        result->containing_oneof_ = nullptr;
      } else {
        result->containing_oneof_ = parent->oneof_decl(proto.oneof_index());
      }
    } else {
      result->containing_oneof_ = nullptr;
    }
  }

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = nullptr;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result,
                    FieldDescriptorProto::kOptionsFieldNumber);
  }


  AddSymbol(result->full_name(), parent, result->name(), proto, Symbol(result));
}